

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

DataTypeSyntax * __thiscall
slang::parsing::Parser::parseDataType
          (Parser *this,bitmask<slang::parsing::detail::TypeOptions> options)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  SyntaxKind SVar3;
  IntegerTypeSyntax *pIVar4;
  SourceLocation SVar5;
  ExpressionSyntax *expr;
  TypeReferenceSyntax *pTVar6;
  undefined8 uVar7;
  ParameterValueAssignmentSyntax *parameters;
  DotMemberClauseSyntax *modport;
  VirtualInterfaceTypeSyntax *pVVar8;
  StructUnionTypeSyntax *pSVar9;
  NameSyntax *pNVar10;
  NamedTypeSyntax *pNVar11;
  EnumTypeSyntax *pEVar12;
  TokenKind kind;
  uint uVar13;
  Token TVar14;
  Token TVar15;
  Token TVar16;
  Token signing;
  Token interfaceKeyword;
  uint32_t index;
  Token local_b0;
  Info *local_a0;
  Token local_98;
  Token local_88;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_78;
  Token local_40;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,WireKeyword);
  if (bVar2) {
    ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x100be0005);
  }
  TVar14 = ParserBase::peek(&this->super_ParserBase);
  kind = TVar14.kind;
  SVar3 = slang::syntax::SyntaxFacts::getIntegerType(kind);
  if (SVar3 == Unknown) {
    uVar13 = TVar14._0_4_ & 0xffff;
    SVar3 = slang::syntax::SyntaxFacts::getKeywordType(kind);
    if (SVar3 == Unknown) {
      if (kind == Identifier) {
        if ((options.m_bits & 1) == 0) goto LAB_001b744a;
        index = 0;
        bVar2 = scanQualifiedName(this,&index,false);
        if (((bVar2) && (bVar2 = scanDimensionList(this,&index), bVar2)) &&
           (TVar14 = ParserBase::peek(&this->super_ParserBase,index), TVar14.kind == Identifier)) {
          pNVar10 = parseName(this);
          pNVar11 = slang::syntax::SyntaxFactory::namedType(&this->factory,pNVar10);
          return &pNVar11->super_DataTypeSyntax;
        }
        Token::Token(&local_40);
        local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
        local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_78.super_SyntaxListBase.childCount = 0;
        local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
             (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)ZEXT816(0);
        local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e8000;
        TVar16 = ParserBase::placeholderToken(&this->super_ParserBase);
      }
      else {
        if (uVar13 == 0xa1) {
          pEVar12 = parseEnum(this);
          pSVar1 = this->previewNode;
          this->previewNode = (SyntaxNode *)pEVar12;
          (pEVar12->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
               pSVar1;
          return &pEVar12->super_DataTypeSyntax;
        }
        if (uVar13 == 0x155) {
LAB_001b744a:
          pNVar10 = parseName(this);
          pNVar11 = slang::syntax::SyntaxFactory::namedType(&this->factory,pNVar10);
          return &pNVar11->super_DataTypeSyntax;
        }
        if (uVar13 == 0x138) {
          TVar14 = ParserBase::consume(&this->super_ParserBase);
          TVar15 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
          expr = parseExpression(this);
          local_98 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
          pTVar6 = slang::syntax::SyntaxFactory::typeReference
                             (&this->factory,TVar14,TVar15,expr,local_98);
          return &pTVar6->super_DataTypeSyntax;
        }
        if (uVar13 == 0x13a) {
          SVar3 = UnionType;
LAB_001b742a:
          pSVar9 = parseStructUnion(this,SVar3);
          return &pSVar9->super_DataTypeSyntax;
        }
        if (uVar13 == 0x145) {
          TVar14 = ParserBase::consume(&this->super_ParserBase);
          local_a0 = TVar14.info;
          local_b0._0_8_ = TVar14._0_8_;
          TVar14 = ParserBase::consumeIf(&this->super_ParserBase,InterfaceKeyword);
          local_b0.info = TVar14.info;
          uVar7 = TVar14._0_8_;
          TVar14 = ParserBase::expect(&this->super_ParserBase,Identifier);
          parameters = parseParameterValueAssignment(this);
          local_88 = TVar14;
          modport = parseDotMemberClause(this);
          TVar16.info = local_a0;
          TVar16.kind = local_b0.kind;
          TVar16._2_1_ = local_b0._2_1_;
          TVar16.numFlags.raw = local_b0.numFlags.raw;
          TVar16.rawLen = local_b0.rawLen;
          interfaceKeyword.info = local_b0.info;
          interfaceKeyword.kind = (short)uVar7;
          interfaceKeyword._2_1_ = (char)((ulong)uVar7 >> 0x10);
          interfaceKeyword.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
          interfaceKeyword.rawLen = (int)((ulong)uVar7 >> 0x20);
          pVVar8 = slang::syntax::SyntaxFactory::virtualInterfaceType
                             (&this->factory,TVar16,interfaceKeyword,local_88,parameters,modport);
          return &pVVar8->super_DataTypeSyntax;
        }
        if (uVar13 == 0x121) {
          SVar3 = StructType;
          goto LAB_001b742a;
        }
        TVar14 = parseSigning(this);
        local_b0._0_8_ = TVar14._0_8_;
        local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
             parseDimensionList(this);
        local_78.super_SyntaxListBase.childCount =
             (size_t)local_78.
                     super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
        if ((options.m_bits & 1) == 0) {
          local_78.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
          SVar5 = Token::location((Token *)&local_78);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x610005,SVar5);
        }
        local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
        local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e8000;
        TVar16 = ParserBase::placeholderToken(&this->super_ParserBase);
        local_40.info = TVar14.info;
        local_40._0_8_ = local_b0._0_8_;
      }
      signing.info = local_40.info;
      signing.kind = local_40.kind;
      signing._2_1_ = local_40._2_1_;
      signing.numFlags.raw = local_40.numFlags.raw;
      signing.rawLen = local_40.rawLen;
      pIVar4 = (IntegerTypeSyntax *)
               slang::syntax::SyntaxFactory::implicitType(&this->factory,signing,&local_78,TVar16);
    }
    else {
      if ((SVar3 == VoidType) && ((options.m_bits & 2) == 0)) {
        local_78.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        SVar5 = Token::location((Token *)&local_78);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xbd0005,SVar5);
      }
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      pIVar4 = (IntegerTypeSyntax *)
               slang::syntax::SyntaxFactory::keywordType(&this->factory,SVar3,TVar14);
    }
  }
  else {
    TVar14 = ParserBase::consume(&this->super_ParserBase);
    TVar15 = parseSigning(this);
    local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
         parseDimensionList(this);
    local_78.super_SyntaxListBase.childCount =
         (size_t)local_78.
                 super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
    local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e8000;
    pIVar4 = slang::syntax::SyntaxFactory::integerType(&this->factory,SVar3,TVar14,TVar15,&local_78)
    ;
  }
  return &pIVar4->super_DataTypeSyntax;
}

Assistant:

DataTypeSyntax& Parser::parseDataType(bitmask<TypeOptions> options) {
    if (peek(TokenKind::WireKeyword))
        skipToken(diag::WireDataType);

    auto kind = peek().kind;
    auto type = getIntegerType(kind);
    if (type != SyntaxKind::Unknown) {
        auto keyword = consume();
        auto signing = parseSigning();
        return factory.integerType(type, keyword, signing, parseDimensionList());
    }

    type = getKeywordType(kind);
    if (type != SyntaxKind::Unknown) {
        if (type == SyntaxKind::VoidType && (options & TypeOptions::AllowVoid) == 0)
            addDiag(diag::VoidNotAllowed, peek().location());
        return factory.keywordType(type, consume());
    }

    switch (kind) {
        case TokenKind::StructKeyword:
            return parseStructUnion(SyntaxKind::StructType);
        case TokenKind::UnionKeyword:
            return parseStructUnion(SyntaxKind::UnionType);
        case TokenKind::EnumKeyword: {
            auto& result = parseEnum();
            result.previewNode = std::exchange(previewNode, &result);
            return result;
        }
        case TokenKind::VirtualKeyword: {
            auto virtualKeyword = consume();
            auto interfaceKeyword = consumeIf(TokenKind::InterfaceKeyword);
            auto name = expect(TokenKind::Identifier);
            auto parameters = parseParameterValueAssignment();
            return factory.virtualInterfaceType(virtualKeyword, interfaceKeyword, name, parameters,
                                                parseDotMemberClause());
        }
        case TokenKind::UnitSystemName:
            return factory.namedType(parseName());
        case TokenKind::TypeKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseExpression();
            return factory.typeReference(keyword, openParen, expr,
                                         expect(TokenKind::CloseParenthesis));
        }
        default:
            break;
    }

    if (kind == TokenKind::Identifier) {
        if ((options & TypeOptions::AllowImplicit) == 0)
            return factory.namedType(parseName());
        else {
            // If we're allowed to have an implicit type here, it means there's a chance this
            // identifier is actually the name of something else (like a declaration) and that the
            // type should be implicit. Check if there's another identifier right after us
            // before deciding which one we're looking at.
            uint32_t index = 0;
            if (scanQualifiedName(index, /* allowNew */ false) && scanDimensionList(index) &&
                peek(index).kind == TokenKind::Identifier) {
                return factory.namedType(parseName());
            }

            return factory.implicitType(Token(), nullptr, placeholderToken());
        }
    }

    auto signing = parseSigning();
    auto dimensions = parseDimensionList();

    if ((options & TypeOptions::AllowImplicit) == 0)
        addDiag(diag::ImplicitNotAllowed, peek().location());

    return factory.implicitType(signing, dimensions, placeholderToken());
}